

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void gimage::extractLines
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,int c,
               int min_size,bool closed,float tolerance)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  long sy;
  Polygon p;
  ImageU8 mask;
  Polygon local_88;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *local_70;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_68;
  
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (uchar *)0x0;
  local_68.row = (uchar **)0x0;
  local_68.img = (uchar ***)0x0;
  local_70 = pl;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (&local_68,image->width,image->height,1);
  __n = -local_68.n;
  if (0 < local_68.n) {
    __n = local_68.n;
  }
  memset(local_68.pixel,0,__n);
  lVar4 = image->height;
  if (0 < lVar4) {
    lVar2 = image->width;
    sy = 0;
    do {
      if (0 < lVar2) {
        lVar4 = 0;
        do {
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (((uint)(*image->img)[sy][lVar4] == c) && ((*local_68.img)[sy][lVar4] == '\0')) {
            extractContour(&local_88,&local_68,image,lVar4,sy,0);
            uVar1 = (long)local_88.vertex.
                          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.vertex.
                          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            if ((int)(uVar1 >> 4) < min_size) {
LAB_00122715:
              if (local_88.vertex.
                  super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0012271f;
            }
            else {
              if (!closed) {
LAB_001226e6:
                if (0.0 <= tolerance) {
                  Polygon::reduce(&local_88,tolerance);
                }
                std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                          (local_70,&local_88);
                goto LAB_00122715;
              }
              if (uVar1 < 0x21) goto LAB_00122715;
              lVar3 = *(long *)((long)local_88.vertex.
                                      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar1 - 0x10)) -
                      (local_88.vertex.
                       super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v[0];
              lVar2 = *(long *)((long)local_88.vertex.
                                      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar1 - 8)) -
                      (local_88.vertex.
                       super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v[1];
              if ((ulong)(lVar2 * lVar2 + lVar3 * lVar3) < 3) goto LAB_001226e6;
            }
            operator_delete(local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
LAB_0012271f:
          lVar4 = lVar4 + 1;
          lVar2 = image->width;
        } while (lVar4 < lVar2);
        lVar4 = image->height;
      }
      sy = sy + 1;
    } while (sy < lVar4);
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_68);
  return;
}

Assistant:

void extractLines(std::vector<Polygon> &pl, const ImageU8 &image, int c, int min_size, bool closed,
  float tolerance)
{
  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == c && mask.get(x, y) == 0)
      {
        extractContour(p, mask, image, x, y, 0);

        if (p.count() >= min_size)
        {
          if (!closed || p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }
      }
    }
  }
}